

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

int compute_string_offset_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Drawonable *pAVar5;
  char *pcVar6;
  size_t sVar7;
  int cursor_offset;
  Am_Drawonable *local_78;
  Am_Drawonable *drawonable_1;
  int full_string_width;
  int max_cursor_index;
  Am_Font font;
  Am_Drawonable *drawonable;
  int width;
  int new_offset;
  Am_Value old_string_offset_value;
  int old_string_offset;
  int cursor_index;
  Am_String local_20;
  Am_String str;
  Am_Object *self_local;
  
  str.data = (Am_String_Data *)self;
  Am_String::Am_String(&local_20);
  pAVar4 = Am_Object::Get((Am_Object *)str.data,0xab,0);
  Am_String::operator=(&local_20,pAVar4);
  bVar1 = Am_String::Valid(&local_20);
  if (bVar1) {
    pAVar4 = Am_Object::Get((Am_Object *)str.data,0xad,0);
    old_string_offset_value.value.long_value._4_4_ = Am_Value::operator_cast_to_int(pAVar4);
    Am_Value::Am_Value((Am_Value *)&width);
    pAVar4 = Am_Object::Peek((Am_Object *)str.data,0x11d,4);
    Am_Value::operator=((Am_Value *)&width,pAVar4);
    bVar1 = Am_Value::Exists((Am_Value *)&width);
    if (bVar1) {
      old_string_offset_value.value.float_value =
           (float)Am_Value::operator_cast_to_int((Am_Value *)&width);
    }
    else {
      old_string_offset_value.value.float_value = 0.0;
    }
    drawonable._4_4_ = old_string_offset_value.value.float_value;
    pAVar4 = Am_Object::Get((Am_Object *)str.data,0x66,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    Am_Object::Am_Object((Am_Object *)&font,(Am_Object *)str.data);
    pAVar5 = GV_a_drawonable((Am_Object *)&font);
    Am_Object::~Am_Object((Am_Object *)&font);
    pAVar4 = Am_Object::Get((Am_Object *)str.data,0xac,0);
    Am_Font::Am_Font((Am_Font *)&full_string_width,pAVar4);
    pcVar6 = Am_String::operator_cast_to_char_(&local_20);
    sVar7 = strlen(pcVar6);
    drawonable_1._4_4_ = (uint)sVar7;
    pcVar6 = Am_String::operator_cast_to_char_(&local_20);
    drawonable_1._0_4_ =
         (*pAVar5->_vptr_Am_Drawonable[0x19])
                   (pAVar5,&full_string_width,pcVar6,(ulong)drawonable_1._4_4_);
    if ((old_string_offset_value.value._0_4_ < 1) ||
       (iVar2 <= (int)drawonable_1 - old_string_offset_value.value._0_4_)) {
      if (-1 < old_string_offset_value.value._4_4_) {
        Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff80,(Am_Object *)str.data);
        pAVar5 = GV_a_drawonable((Am_Object *)&stack0xffffffffffffff80);
        Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff80);
        local_78 = pAVar5;
        pAVar4 = Am_Object::Get((Am_Object *)str.data,0xae,0);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        if (iVar3 < old_string_offset_value.value._0_4_) {
          if (iVar3 == 0) {
            drawonable._4_4_ = 0.0;
          }
          else {
            iVar2 = imax(0,old_string_offset_value.value.long_value._4_4_);
            old_string_offset_value.value.long_value._4_4_ = imin(iVar2,drawonable_1._4_4_);
            pAVar5 = local_78;
            pcVar6 = Am_String::operator_cast_to_char_(&local_20);
            drawonable._4_4_ =
                 (float)(*pAVar5->_vptr_Am_Drawonable[0x19])
                                  (pAVar5,&full_string_width,pcVar6,
                                   (ulong)(uint)old_string_offset_value.value.long_value._4_4_);
          }
        }
        else if ((int)old_string_offset_value.value.float_value + iVar2 < iVar3) {
          iVar3 = imax(0,old_string_offset_value.value.long_value._4_4_);
          old_string_offset_value.value.long_value._4_4_ = imin(iVar3,drawonable_1._4_4_);
          pAVar5 = local_78;
          pcVar6 = Am_String::operator_cast_to_char_(&local_20);
          iVar3 = (*pAVar5->_vptr_Am_Drawonable[0x19])
                            (pAVar5,&full_string_width,pcVar6,
                             (ulong)(uint)old_string_offset_value.value.long_value._4_4_);
          drawonable._4_4_ = (float)(iVar3 - iVar2);
          if ((int)drawonable._4_4_ < 0) {
            drawonable._4_4_ = 0.0;
          }
        }
      }
    }
    else {
      drawonable._4_4_ = (float)imax(0,(int)drawonable_1 - iVar2);
    }
    self_local._4_4_ = drawonable._4_4_;
    Am_Font::~Am_Font((Am_Font *)&full_string_width);
    Am_Value::~Am_Value((Am_Value *)&width);
  }
  else {
    self_local._4_4_ = 0.0;
  }
  Am_String::~Am_String(&local_20);
  return (int)self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, compute_string_offset)
{
  Am_String str;
  str = self.Get(Am_TEXT);
  if (!str.Valid())
    return 0; // no string in there, so offset 0.

  int cursor_index = self.Get(Am_CURSOR_INDEX);
  // get old value of this slot
  int old_string_offset;
  Am_Value old_string_offset_value;
  old_string_offset_value = self.Peek(Am_X_OFFSET, Am_NO_DEPENDENCY);
  if (!old_string_offset_value.Exists())
    old_string_offset = 0;
  else
    old_string_offset = old_string_offset_value;

  int new_offset = old_string_offset;
  int width = self.Get(Am_WIDTH);
  Am_Drawonable *drawonable = GV_a_drawonable(self);
  Am_Font font(self.Get(Am_FONT));

  int max_cursor_index = strlen(str);
  int full_string_width =
      drawonable->Get_String_Width(font, str, max_cursor_index);
  if (old_string_offset > 0 && full_string_width - old_string_offset < width) {
    //then need to scroll because width changed
    new_offset = imax(0, full_string_width - width);
  } else if (cursor_index >= 0) { //otherwise, don't change position
    Am_Drawonable *drawonable = GV_a_drawonable(self);
    int cursor_offset = self.Get(Am_CURSOR_OFFSET);
    if (cursor_offset < old_string_offset) { // then scroll right
      if (cursor_offset == 0)
        new_offset = 0;
      else {
        // find the position of the character at the cursor
        cursor_index = imin(imax(0, cursor_index), max_cursor_index);
        new_offset = drawonable->Get_String_Width(font, str, cursor_index);
      }
    } else {
      if (cursor_offset > old_string_offset + width) { // scroll left
        // find the position of the character at the cursor
        cursor_index = imin(imax(0, cursor_index), max_cursor_index);
        new_offset = drawonable->Get_String_Width(font, str, cursor_index);
        new_offset = new_offset - width;
        if (new_offset < 0)
          new_offset = 0;
      }
    }
  }
  return new_offset;
}